

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeFeaturesTests.cpp
# Opt level: O3

void __thiscall agge::joins::tests::BevelJoinTests::OuterJoinIsBeveled(BevelJoinTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  double dVar4;
  point_r seq1 [3];
  bevel j;
  point_r reference2 [4];
  point_r seq2 [3];
  point_r reference3 [2];
  point_r reference1 [2];
  point_r local_118;
  point_r pStack_110;
  point_r local_108 [2];
  points local_f8;
  bevel local_d8;
  LocationInfo local_d0;
  string local_a8;
  undefined1 local_88 [12];
  float fStack_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  point_r local_68;
  point_r pStack_60;
  point_r local_58 [2];
  point<float> local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  point<float> local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_118.x = 3.1;
  local_118.y = 3.1;
  pStack_110.x = 7.1;
  pStack_110.y = 2.3;
  local_108[0].x = 17.2;
  local_108[0].y = 3.1;
  local_68.x = 3.1;
  local_68.y = 3.1;
  pStack_60.x = 7.1;
  pStack_60.y = 9.3;
  local_58[0].x = 3.7;
  local_58[0].y = 16.5;
  local_f8._begin = (point<float> *)0x0;
  local_f8._end = (point<float> *)0x0;
  local_f8._limit = (point<float> *)0x0;
  local_d8.super_join._vptr_join = (join)&PTR__join_001c32d8;
  dVar3 = sqrt(5.43098297592073e-315);
  dVar4 = sqrt(5.53724466840962e-315);
  bevel::calc(&local_d8,&local_f8,1.0,&local_118,SUB84(dVar3,0),&pStack_110,SUB84(dVar4,0),local_108
             );
  local_38.x = 6.90388;
  local_38.y = 1.31942;
  uStack_30 = 0x40e5ba0a;
  uStack_2c = 0x3fa6cca3;
  local_88._0_8_ = &local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_d0,(string *)local_88,0x2a);
  ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
            ((point<float> (*) [2])&local_38,&local_f8,&local_d0);
  paVar1 = &local_d0.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  dVar3 = sqrt((double)(ulong)(uint)((pStack_110.x - local_118.x) * (pStack_110.x - local_118.x) +
                                    (pStack_110.y - local_118.y) * (pStack_110.y - local_118.y)));
  dVar4 = sqrt((double)(ulong)(uint)((local_108[0].x - pStack_110.x) *
                                     (local_108[0].x - pStack_110.x) +
                                    (local_108[0].y - pStack_110.y) *
                                    (local_108[0].y - pStack_110.y)));
  bevel::calc(&local_d8,&local_f8,1.75,&local_118,SUB84(dVar3,0),&pStack_110,SUB84(dVar4,0),
              local_108);
  local_78._M_allocated_capacity = 0x3f157ffa40d837b5;
  local_78._8_8_ = 0x3f0e32e440e79f2c;
  local_88._0_4_ = 6.90388;
  local_88._4_4_ = 1.31942;
  local_88._8_4_ = 7.17896;
  fStack_7c = 1.30312;
  paVar2 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_d0,&local_a8,0x37);
  ut::are_equal<agge::point<float>,4ul,agge::pod_vector<agge::point<float>>>
            ((point<float> (*) [4])local_88,&local_f8,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  local_f8._end = local_f8._begin;
  dVar3 = sqrt(5.49983386948683e-315);
  dVar4 = sqrt(5.5114385229016e-315);
  bevel::calc(&local_d8,&local_f8,1.75,&local_68,SUB84(dVar3,0),&pStack_60,SUB84(dVar4,0),local_58);
  local_48.x = 8.57052;
  local_48.y = 8.35128;
  uStack_40 = 0x410aeb46;
  uStack_3c = 0x4120c1be;
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeFeaturesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_d0,&local_a8,0x45);
  ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
            ((point<float> (*) [2])&local_48,&local_f8,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_f8._begin != (point<float> *)0x0) {
    operator_delete__(local_f8._begin);
  }
  return;
}

Assistant:

test( OuterJoinIsBeveled )
				{
					// INIT
					const point_r seq1[] = {
						{ 3.1f, 3.1f },
						{ 7.1f, 2.3f },
						{ 17.2f, 3.1f },
					};
					const point_r seq2[] = {
						{ 3.1f, 3.1f },
						{ 7.1f, 9.3f },
						{ 3.7f, 16.5f },
					};
					points output;
					bevel j;

					// ACT
					j.calc(output, 1.0f, seq1[0], distance(seq1[0], seq1[1]), seq1[1], distance(seq1[1], seq1[2]), seq1[2]);

					// ASSERT
					point_r reference1[] = {
						{ 6.90388f, 1.31942f },
						{ 7.17896f, 1.30312f },
					};

					assert_equal(reference1, output);

					// ACT
					j.calc(output, 1.75f, seq1[0], distance(seq1[0], seq1[1]), seq1[1], distance(seq1[1], seq1[2]), seq1[2]);

					// ASSERT
					point_r reference2[] = {
						{ 6.90388f, 1.31942f },
						{ 7.17896f, 1.30312f },
						{ 6.75680f, 0.583984f },
						{ 7.23818f, 0.555464f },
					};

					assert_equal(reference2, output);

					// INIT
					output.clear();

					// ACT
					j.calc(output, 1.75f, seq2[0], distance(seq2[0], seq2[1]), seq2[1], distance(seq2[1], seq2[2]), seq2[2]);

					// ASSERT
					point_r reference3[] = {
						{ 8.57052f, 8.35128f },
						{ 8.68244f, 10.0473f },
					};

					assert_equal(reference3, output);
				}